

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
::ReadNumericExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                  *this,char code,bool ignore_zero)

{
  int iVar1;
  NumericExpr NVar2;
  byte in_DL;
  char in_SIL;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  *in_RDI;
  double dVar3;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  *in_stack_00000008;
  double value;
  int i;
  CallArgHandler args;
  int num_args;
  int func_index;
  int in_stack_000000c4;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  *in_stack_000000c8;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  ExprBase in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffbc;
  TextReader<fmt::Locale> *in_stack_ffffffffffffffc0;
  TextReader<fmt::Locale> *in_stack_ffffffffffffffc8;
  CStringRef in_stack_ffffffffffffffd0;
  int local_24;
  ExprBase local_8;
  
  switch((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          *)(ulong)((int)in_SIL - 0x66)) {
  case (NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
        *)0x0:
    ReadUInt((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
              *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    iVar1 = TextReader<fmt::Locale>::ReadUInt((TextReader<fmt::Locale> *)0x4cdd03);
    TextReader<fmt::Locale>::ReadTillEndOfLine(in_stack_ffffffffffffffc0);
    NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
    ::BeginCall((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                 *)in_stack_ffffffffffffffa0.impl_,in_stack_ffffffffffffff9c,
                in_stack_ffffffffffffff98);
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      ReadSymbolicExpr(in_stack_00000008);
      NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
      ::ArgHandler::AddArg
                ((ArgHandler *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (Expr)in_stack_ffffffffffffffa0.impl_);
    }
    local_8.impl_ =
         (Impl *)NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                 ::EndCall((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                            *)in_RDI->handler_);
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffb8,"expected expression");
    TextReader<fmt::Locale>::ReportError<>(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
    goto LAB_004cde26;
  case (NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
        *)0x6:
  case (NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
        *)0x8:
  case (NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
        *)0xd:
    dVar3 = ReadConstant((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                          *)in_stack_ffffffffffffffc0,(char)(in_stack_ffffffffffffffbc >> 0x18));
    if ((((in_DL & 1) == 0) || (dVar3 != 0.0)) || (NAN(dVar3))) {
      NVar2 = NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
              ::OnNumber((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                          *)in_RDI,(double)in_stack_ffffffffffffffa0.impl_);
      return (NumericExpr)(Impl *)NVar2.super_ExprBase.impl_;
    }
LAB_004cde26:
    BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr
              ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)0x4cde30);
    break;
  case (NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
        *)0x9:
    ReadOpCode((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                *)(ulong)((int)in_SIL - 0x66));
    local_8.impl_ = (Impl *)ReadNumericExpr(in_stack_000000c8,in_stack_000000c4);
    break;
  case (NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
        *)0x10:
    local_8.impl_ = (Impl *)DoReadReference(in_RDI);
  }
  return (NumericExpr)(ExprBase)local_8.impl_;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(char code, bool ignore_zero) {
  switch (code) {
  case 'f': {
    // Read a function call.
    int func_index = ReadUInt(header_.num_funcs);
    int num_args = reader_.ReadUInt();
    reader_.ReadTillEndOfLine();
    typename Handler::CallArgHandler args =
        handler_.BeginCall(func_index, num_args);
    for (int i = 0; i < num_args; ++i)
      args.AddArg(ReadSymbolicExpr());
    return handler_.EndCall(args);
  }
  case 'n': case 'l': case 's': {
    // Read a number.
    double value = ReadConstant(code);
    if (ignore_zero && value == 0)
      break;  // Ignore zero constant.
    return handler_.OnNumber(value);
  }
  case 'o':
    return ReadNumericExpr(ReadOpCode());
  case 'v':
    return DoReadReference();
  default:
    reader_.ReportError("expected expression");
  }
  return NumericExpr();
}